

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O1

size_t ellipses::find_weakest_element
                 (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *ellipses)

{
  long *plVar1;
  pointer pRVar2;
  const_iterator __begin0;
  pointer pPVar3;
  pointer pRVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  Point2f *pPVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  pointer pRVar12;
  size_t sVar13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var14;
  bool bVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar25;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar26;
  vector<double,_std::allocator<double>_> distances;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bad_score;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> centers;
  vector<double,_std::allocator<double>_> ratios;
  vector<float,_std::allocator<float>_> angles;
  allocator_type local_c1;
  vector<double,_std::allocator<double>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  pRVar4 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  uVar7 = ((long)pRVar2 - (long)pRVar4 >> 2) * -0x3333333333333333;
  bVar15 = pRVar2 != pRVar4;
  if (bVar15) {
    pfVar5 = &(pRVar4->size).height;
    sVar13 = 0;
    do {
      if (((((pfVar5[-3] == 0.0) && (!NAN(pfVar5[-3]))) && (pfVar5[-2] == 0.0)) &&
          ((!NAN(pfVar5[-2]) && (((Size2f *)(pfVar5 + -1))->width == 0.0)))) &&
         ((!NAN(((Size2f *)(pfVar5 + -1))->width) && ((*pfVar5 == 0.0 && (!NAN(*pfVar5))))))) {
        if (bVar15) {
          return sVar13;
        }
        break;
      }
      sVar13 = sVar13 + 1;
      bVar15 = sVar13 < uVar7;
      pfVar5 = pfVar5 + 5;
    } while (uVar7 + (uVar7 == 0) != sVar13);
  }
  local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,uVar7,(value_type_conflict1 *)&local_c0,(allocator_type *)&local_90);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c0,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (allocator_type *)&local_90);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&local_90,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (allocator_type *)&local_60);
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  pPVar8 = local_90.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (pRVar4 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
                _M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar2; pRVar4 = pRVar4 + 1) {
    *pPVar8 = pRVar4->center;
    pPVar8 = pPVar8 + 1;
  }
  if (local_90.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_90.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fVar24 = 0.0;
    fVar23 = 0.0;
  }
  else {
    lVar6 = (long)local_90.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_90.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    auVar21._8_4_ =
         (int)((long)local_90.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_90.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 0x23);
    auVar21._0_8_ = lVar6;
    auVar21._12_4_ = 0x45300000;
    dVar17 = (auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    dVar18 = 0.0;
    dVar20 = 0.0;
    pPVar3 = local_90.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      dVar18 = dVar18 + (double)pPVar3->x / dVar17;
      dVar20 = dVar20 + (double)pPVar3->y / dVar17;
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != local_90.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    fVar23 = (float)(int)dVar18;
    fVar24 = (float)(int)dVar20;
  }
  pRVar4 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl.
      super__Vector_impl_data._M_finish != pRVar4) {
    lVar6 = 4;
    uVar7 = 0;
    local_38 = ZEXT416((uint)fVar23);
    local_48 = ZEXT416((uint)fVar24);
    do {
      fVar16 = fVar23 - *(float *)((long)pRVar4 + lVar6 + -4);
      fVar19 = fVar24 - *(float *)((long)&(pRVar4->center).x + lVar6);
      fVar16 = fVar16 * fVar16 + fVar19 * fVar19;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
        fVar23 = (float)local_38._0_4_;
        fVar24 = (float)local_48._0_4_;
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] = (double)fVar16;
      uVar7 = uVar7 + 1;
      pRVar4 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x14;
    } while (uVar7 < (ulong)(((long)(ellipses->
                                    super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 2)
                            * -0x3333333333333333));
  }
  pVar25 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 3);
  if (20.0 < *pVar25.second._M_current._M_current) {
    plVar1 = (long *)((long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                     ((long)pVar25.second._M_current._M_current -
                     (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start));
    *plVar1 = *plVar1 + 1;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_60,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (allocator_type *)&local_78);
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  pRVar4 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pfVar5 = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pRVar12 = pRVar4; pRVar12 != pRVar2; pRVar12 = pRVar12 + 1) {
    *pfVar5 = pRVar12->angle;
    pfVar5 = pfVar5 + 1;
  }
  fVar23 = 0.0;
  for (pfVar5 = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar5 != local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar5 = pfVar5 + 1) {
    fVar23 = fVar23 + *pfVar5;
  }
  lVar6 = (long)pRVar2 - (long)pRVar4;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 2) * -0x3333333333333333;
    pfVar5 = &pRVar4->angle;
    lVar9 = 0;
    do {
      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] =
           (double)ABS(fVar23 / (float)(ulong)((long)local_60.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_60.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2) -
                       *pfVar5);
      lVar9 = lVar9 + 1;
      pfVar5 = pfVar5 + 5;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
  }
  pVar25 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 3);
  plVar1 = (long *)((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   ((long)pVar25.second._M_current._M_current -
                   (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start));
  *plVar1 = *plVar1 + 1;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_78,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,&local_c1
            );
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  pRVar4 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pdVar10 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pRVar12 = pRVar4; pRVar12 != pRVar2; pRVar12 = pRVar12 + 1) {
    *pdVar10 = (double)(pRVar12->size).width / (double)(pRVar12->size).height;
    pdVar10 = pdVar10 + 1;
  }
  dVar18 = 0.0;
  for (pdVar10 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pdVar10 !=
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; pdVar10 = pdVar10 + 1) {
    dVar18 = dVar18 + *pdVar10;
  }
  lVar6 = (long)pRVar2 - (long)pRVar4;
  if (lVar6 != 0) {
    lVar9 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    auVar22._8_4_ =
         (int)((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x23);
    auVar22._0_8_ = lVar9;
    auVar22._12_4_ = 0x45300000;
    lVar6 = (lVar6 >> 2) * -0x3333333333333333;
    pfVar5 = &(pRVar4->size).height;
    lVar11 = 0;
    do {
      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] =
           ABS(dVar18 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) -
               (double)((Size2f *)(pfVar5 + -1))->width / (double)*pfVar5);
      lVar11 = lVar11 + 1;
      pfVar5 = pfVar5 + 5;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
  }
  pVar25 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 3);
  if (0.01 < *pVar25.second._M_current._M_current) {
    plVar1 = (long *)((long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                     ((long)pVar25.second._M_current._M_current -
                     (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start));
    *plVar1 = *plVar1 + 1;
  }
  pVar26 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  _Var14._M_current = pVar26.second._M_current._M_current;
  if (*pVar26.second._M_current._M_current < 2) {
    _Var14._M_current =
         local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  lVar6 = (long)_Var14._M_current -
          (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (Point2f *)0x0) {
    operator_delete(local_90.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar6 >> 3;
}

Assistant:

std::size_t find_weakest_element(const std::vector<cv::RotatedRect>& ellipses)
{
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(ellipses[i].center == cv::Point2f() && ellipses[i].size == cv::Size2f())
        {
            return i;
        }
    }

    std::vector<std::size_t> bad_score(ellipses.size(), 0);
    std::vector<double> distances(ellipses.size());

    std::vector<cv::Point2f> centers(ellipses.size());
    std::transform(
        ellipses.begin(), ellipses.end(), centers.begin(), [](const cv::RotatedRect& e) { return e.center; });
    auto mcenter = center_of_mass(centers);
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = euclideanDistance(
            cv::Point2f(static_cast<float>(mcenter.x), static_cast<float>(mcenter.y)), ellipses[i].center);
    }
    auto max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 20)
        bad_score[std::distance(distances.begin(), max)]++;

    std::vector<float> angles(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), angles.begin(), [](const cv::RotatedRect& e) { return e.angle; });
    auto mangles = std::accumulate(angles.begin(), angles.end(), 0.f) / angles.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = std::abs(mangles - ellipses[i].angle);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    bad_score[std::distance(distances.begin(), max)]++;

    std::vector<double> ratios(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), ratios.begin(), [](const cv::RotatedRect& e) {
#if CV_MAJOR_VERSION < 3
        return e.size.width / static_cast<double>(e.size.height);
#else //! CV_MAJOR_VERSION > 3
            return e.size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3
    });
    auto mratios = std::accumulate(ratios.begin(), ratios.end(), 0.) / ratios.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
#if CV_MAJOR_VERSION < 3
        double aspect = ellipses[i].size.width / static_cast<double>(ellipses[i].size.height);
#else //! CV_MAJOR_VERSION > 3
        double aspect = ellipses[i].size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3

        distances[i] = std::abs(mratios - aspect);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 0.01)
        bad_score[std::distance(distances.begin(), max)]++;

    auto max_bad = std::minmax_element(bad_score.begin(), bad_score.end()).second;
    if(*max_bad > 1)
        return std::distance(bad_score.begin(), max_bad);
    return bad_score.size();
}